

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall
kj::_::Debug::logInternal
          (Debug *this,char *file,int line,LogSeverity severity,char *macroArgs,
          ArrayPtr<kj::String> argValues)

{
  ArrayPtr<kj::String> argValues_00;
  uint uVar1;
  uint uVar2;
  ExceptionCallback *pEVar3;
  char *pcVar4;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  String *in_R9;
  StringPtr filename;
  String local_68;
  StringPtr local_50;
  ArrayPtr<const_char> local_40;
  char *local_30;
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  ArrayPtr<kj::String> argValues_local;
  
  local_30 = (char *)CONCAT44(in_register_0000000c,severity);
  macroArgs_local._4_4_ = (uint)file;
  macroArgs_local._0_4_ = line;
  _severity_local = this;
  file_local = macroArgs;
  argValues_local.ptr = in_R9;
  pEVar3 = getExceptionCallback();
  uVar1 = (uint)macroArgs_local;
  StringPtr::StringPtr(&local_50,(char *)_severity_local);
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = (char *)local_50.content.size_;
  local_40 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_50.content.ptr,filename);
  pcVar4 = StringPtr::cStr((StringPtr *)&local_40);
  uVar2 = macroArgs_local._4_4_;
  argValues_00.size_ = (size_t)argValues_local.ptr;
  argValues_00.ptr = (String *)file_local;
  anon_unknown_2::makeDescriptionImpl(&local_68,LOG,(char *)0x0,0,(char *)0x0,local_30,argValues_00)
  ;
  (*pEVar3->_vptr_ExceptionCallback[4])(pEVar3,(ulong)uVar1,pcVar4,(ulong)uVar2,0,&local_68);
  String::~String(&local_68);
  return;
}

Assistant:

void Debug::logInternal(const char* file, int line, LogSeverity severity, const char* macroArgs,
                        ArrayPtr<String> argValues) {
  getExceptionCallback().logMessage(severity, trimSourceFilename(file).cStr(), line, 0,
      makeDescriptionImpl(LOG, nullptr, 0, nullptr, macroArgs, argValues));
}